

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O1

btree<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>,_256,_false>_>
* __thiscall
phmap::priv::
btree<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>,_256,_false>_>
::operator=(btree<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>,_256,_false>_>
            *this,btree<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>,_256,_false>_>
                  *x)

{
  node_type *pnVar1;
  
  if (this != x) {
    if (this->size_ != 0) {
      internal_clear(this,(this->root_).
                          super__Tuple_impl<0UL,_std::less<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>,_256,_false>_>_*>
                          .
                          super__Tuple_impl<1UL,_phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>,_256,_false>_>_*>
                          .
                          super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>,_256,_false>_>_*>
                          .
                          super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>,_256,_false>_>_*,_false>
                          ._M_head_impl);
    }
    (this->root_).
    super__Tuple_impl<0UL,_std::less<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>,_256,_false>_>_*>
    .
    super__Tuple_impl<1UL,_phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>,_256,_false>_>_*>
    .
    super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>,_256,_false>_>_*>
    .
    super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>,_256,_false>_>_*,_false>
    ._M_head_impl =
         (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>,_256,_false>_>
          *)btree<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,std::less<phmap::test_internal::MovableOnlyInstance>,phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>,256,false>>
            ::EmptyNode()::empty_node;
    this->rightmost_ =
         (node_type *)
         btree<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,std::less<phmap::test_internal::MovableOnlyInstance>,phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>,256,false>>
         ::EmptyNode()::empty_node;
    this->size_ = 0;
    if ((this->root_).
        super__Tuple_impl<0UL,_std::less<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>,_256,_false>_>_*>
        .
        super__Tuple_impl<1UL,_phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>,_256,_false>_>_*>
        .
        super__Head_base<1UL,_phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>,_false>
        ._M_head_impl.bytes_used_ ==
        (x->root_).
        super__Tuple_impl<0UL,_std::less<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>,_256,_false>_>_*>
        .
        super__Tuple_impl<1UL,_phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>,_256,_false>_>_*>
        .
        super__Head_base<1UL,_phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>,_false>
        ._M_head_impl.bytes_used_) {
      (this->root_).
      super__Tuple_impl<0UL,_std::less<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>,_256,_false>_>_*>
      .
      super__Tuple_impl<1UL,_phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>,_256,_false>_>_*>
      .
      super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>,_256,_false>_>_*>
      .
      super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>,_256,_false>_>_*,_false>
      ._M_head_impl =
           (x->root_).
           super__Tuple_impl<0UL,_std::less<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>,_256,_false>_>_*>
           .
           super__Tuple_impl<1UL,_phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>,_256,_false>_>_*>
           .
           super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>,_256,_false>_>_*>
           .
           super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>,_256,_false>_>_*,_false>
           ._M_head_impl;
      (x->root_).
      super__Tuple_impl<0UL,_std::less<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>,_256,_false>_>_*>
      .
      super__Tuple_impl<1UL,_phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>,_256,_false>_>_*>
      .
      super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>,_256,_false>_>_*>
      .
      super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>,_256,_false>_>_*,_false>
      ._M_head_impl =
           (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>,_256,_false>_>
            *)btree<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,std::less<phmap::test_internal::MovableOnlyInstance>,phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>,256,false>>
              ::EmptyNode()::empty_node;
      pnVar1 = this->rightmost_;
      this->rightmost_ = x->rightmost_;
      x->rightmost_ = pnVar1;
      this->size_ = x->size_;
      x->size_ = 0;
    }
    else {
      btree<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,std::less<phmap::test_internal::MovableOnlyInstance>,phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>,256,false>>
      ::
      copy_or_move_values_in_order<phmap::priv::btree<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,std::less<phmap::test_internal::MovableOnlyInstance>,phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>,256,false>>>
                ((btree<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,std::less<phmap::test_internal::MovableOnlyInstance>,phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>,256,false>>
                  *)this,x);
    }
  }
  return this;
}

Assistant:

auto btree<P>::operator=(btree &&x) noexcept -> btree & {
        if (this != &x) {
            clear();

            using std::swap;
            if (phmap::allocator_traits<
                allocator_type>::propagate_on_container_copy_assignment::value) {
                // Note: `root_` also contains the allocator and the key comparator.
                swap(root_, x.root_);
                swap(rightmost_, x.rightmost_);
                swap(size_, x.size_);
            } else {
                if (allocator() == x.allocator()) {
                    swap(mutable_root(), x.mutable_root());
                    swap(*mutable_key_comp(), *x.mutable_key_comp());
                    swap(rightmost_, x.rightmost_);
                    swap(size_, x.size_);
                } else {
                    // We aren't allowed to propagate the allocator and the allocator is
                    // different so we can't take over its memory. We must move each element
                    // individually. We need both `x` and `this` to have `x`s key comparator
                    // while moving the values so we can't swap the key comparators.
                    *mutable_key_comp() = x.key_comp();
                    copy_or_move_values_in_order(&x);
                }
            }
        }
        return *this;
    }